

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::StringMaker<long_long,void>::convert_abi_cxx11_(longlong value)

{
  ReusableStringStream *this;
  long in_RSI;
  string *in_RDI;
  ReusableStringStream rss;
  ReusableStringStream *in_stack_ffffffffffffff98;
  ReusableStringStream *in_stack_ffffffffffffffa0;
  ReusableStringStream *in_stack_ffffffffffffffd0;
  
  ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffffd0);
  ReusableStringStream::operator<<(in_stack_ffffffffffffffa0,(longlong *)in_stack_ffffffffffffff98);
  if (0xff < in_RSI) {
    ReusableStringStream::operator<<
              (in_stack_ffffffffffffffa0,(char (*) [5])in_stack_ffffffffffffff98);
    this = ReusableStringStream::operator<<
                     (in_stack_ffffffffffffffa0,
                      (_func_ios_base_ptr_ios_base_ptr *)in_stack_ffffffffffffff98);
    in_stack_ffffffffffffff98 =
         ReusableStringStream::operator<<(this,(longlong *)in_stack_ffffffffffffff98);
    ReusableStringStream::operator<<(this,(char *)in_stack_ffffffffffffff98);
  }
  ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffff98);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)in_RDI);
  return in_RDI;
}

Assistant:

std::string StringMaker<long long>::convert(long long value) {
    ReusableStringStream rss;
    rss << value;
    if (value > Detail::hexThreshold) {
        rss << " (0x" << std::hex << value << ')';
    }
    return rss.str();
}